

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O0

bool_t oidIsValid(char *oid)

{
  bool_t bVar1;
  char *in_RDI;
  size_t n;
  size_t pos;
  u32 d1;
  u32 val;
  ulong local_28;
  long lVar2;
  uint local_18;
  uint local_14;
  char *local_10;
  uint local_4;
  
  local_14 = 0;
  local_18 = 0;
  lVar2 = 0;
  local_28 = 0;
  bVar1 = strIsValid((char *)0x0);
  local_10 = in_RDI;
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    while( true ) {
      for (; (local_10[lVar2] != '.' && (local_10[lVar2] != '\0')); lVar2 = lVar2 + 1) {
        if (((((local_10[lVar2] < '0') || ('9' < local_10[lVar2])) ||
             ((lVar2 == 1 && (*local_10 == '0')))) || (0x19999999 < local_14)) ||
           ((local_14 == 0x19999999 && (5 < (int)local_10[lVar2] - 0x30U)))) {
          local_28 = 0;
          goto LAB_0011b4da;
        }
        local_14 = local_10[lVar2] + -0x30 + local_14 * 10;
      }
      if ((((lVar2 == 0) || ((local_28 == 0 && (2 < local_14)))) ||
          ((local_28 == 1 && ((local_18 < 2 && (0x27 < local_14)))))) ||
         ((local_28 == 1 && (local_18 * -0x28 - 1 < local_14)))) break;
      if (local_28 == 0) {
        local_18 = local_14;
      }
      local_28 = local_28 + 1;
      if (local_10[lVar2] == '\0') goto LAB_0011b4da;
      local_10 = local_10 + lVar2 + 1;
      lVar2 = 0;
      local_14 = 0;
    }
    local_28 = 0;
LAB_0011b4da:
    local_4 = (uint)(1 < local_28);
  }
  return local_4;
}

Assistant:

bool_t oidIsValid(const char* oid)
{
	u32 val = 0;
	u32 d1 = 0;
	size_t pos = 0;
	size_t n = 0;
	// pre
	if (!strIsValid(oid))
		return FALSE;
	// цикл по символам oid
	while (1)
	{
		// закончили очередное число?
		if (oid[pos] == '.' || oid[pos] == '\0')
		{
			// пустое число? d1 > 2? d1 < 2 && d2 >= 40?
			// 40 * d1 + d2 не укладывается в u32?
			if (pos == 0 ||
				n == 0 && val > 2 ||
				n == 1 && d1 < 2 && val >= 40 ||
				n == 1 && val > U32_MAX - 40 * d1)
			{
				n = 0;
				break;
			}
			// сохранить d1
			if (n == 0)
				d1 = val;
			// закончить обработку
			n++;
			// конец строки?
			if (oid[pos] == '\0')
				break;
			// к следующему числу (пропустить .)
			oid += ++pos, pos = 0, val = 0;
			continue;
		}
		// недопустимый символ? лидирующий 0? переполнение?
		if (oid[pos] < '0' || oid[pos] > '9' ||
			pos == 1 && oid[0] == '0' ||
			val > U32_MAX / 10 ||
			val == U32_MAX / 10 && (u32)(oid[pos] - '0') > U32_MAX % 10)
		{
			n = 0;
			break;
		}
		// обработать цифру
		val *= 10;
		val += oid[pos] - '0';
		++pos;
	}
	// очистка и выход
	val = d1 = 0, pos = 0;
	return n >= 2;
}